

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.h
# Opt level: O2

BBox3fa * __thiscall
embree::sse2::BVHNRefitT<4,_embree::Instance,_embree::InstancePrimitive>::leafBounds
          (BBox3fa *__return_storage_ptr__,
          BVHNRefitT<4,_embree::Instance,_embree::InstancePrimitive> *this,NodeRef *ref)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  Instance *pIVar2;
  AffineSpace3ff *pAVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar26;
  BBox3fa *bounds;
  bool bVar27;
  float fVar28;
  float fVar31;
  float fVar32;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar43;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  float fVar45;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar55;
  float fVar56;
  undefined1 auVar52 [16];
  float fVar57;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float local_38;
  float local_18;
  float fStack_14;
  
  if (ref->ptr != 8) {
    lVar26 = (ulong)((uint)ref->ptr & 0xf) - 8;
    pIVar2 = this->mesh;
    aVar43 = _DAT_01f45a40;
    aVar44 = _DAT_01f45a30;
    while (bVar27 = lVar26 != 0, lVar26 = lVar26 + -1, bVar27) {
      pAVar3 = pIVar2->local2world;
      if ((pIVar2->super_Geometry).field_8.field_0x1 == '\x01') {
        fVar28 = (pAVar3->p).field_0.m128[3];
        fVar31 = (pAVar3->l).vx.field_0.m128[3];
        fVar32 = (pAVar3->l).vy.field_0.m128[3];
        fVar37 = (pAVar3->l).vz.field_0.m128[3];
        aVar1 = (pAVar3->l).vx.field_0.field_1;
        fVar67 = (pAVar3->l).vy.field_0.m128[0];
        fVar69 = (pAVar3->l).vy.field_0.m128[1];
        fVar45 = fVar31 * fVar32 + fVar28 * fVar37;
        fVar36 = fVar31 * fVar32 - fVar28 * fVar37;
        fVar47 = fVar28 * fVar28 + fVar31 * fVar31 + -fVar32 * fVar32 + -fVar37 * fVar37;
        fVar71 = fVar28 * fVar28 - fVar31 * fVar31;
        fVar49 = fVar32 * fVar32 + fVar71 + -fVar37 * fVar37;
        fVar33 = fVar31 * fVar37 - fVar28 * fVar32;
        fVar41 = fVar28 * fVar32 + fVar31 * fVar37;
        fVar38 = fVar32 * fVar37 + fVar28 * fVar31;
        fVar66 = fVar32 * fVar37 - fVar28 * fVar31;
        fVar35 = fVar37 * fVar37 + fVar71 + -fVar32 * fVar32;
        fVar28 = (pAVar3->l).vz.field_0.m128[0];
        fVar31 = (pAVar3->l).vz.field_0.m128[1];
        fVar32 = (pAVar3->l).vz.field_0.m128[2];
        fVar45 = fVar45 + fVar45;
        fVar33 = fVar33 + fVar33;
        fVar37 = (pAVar3->p).field_0.m128[0];
        fVar71 = (pAVar3->p).field_0.m128[1];
        fVar34 = (pAVar3->p).field_0.m128[2];
        fVar36 = fVar36 + fVar36;
        fVar38 = fVar38 + fVar38;
        fVar41 = fVar41 + fVar41;
        fVar66 = fVar66 + fVar66;
        fVar68 = fVar47 * 1.0 + fVar45 * 0.0 + fVar33 * 0.0;
        fVar70 = fVar47 * 0.0 + fVar45 * 1.0 + fVar33 * 0.0;
        fVar39 = fVar47 * 0.0 + fVar45 * 0.0 + fVar33 * 1.0;
        fVar40 = fVar47 * 0.0 + fVar45 * 0.0 + fVar33 * 0.0;
        fVar45 = fVar36 * 1.0 + fVar49 * 0.0 + fVar38 * 0.0;
        fVar47 = fVar36 * 0.0 + fVar49 * 1.0 + fVar38 * 0.0;
        fVar48 = fVar36 * 0.0 + fVar49 * 0.0 + fVar38 * 1.0;
        fVar49 = fVar36 * 0.0 + fVar49 * 0.0 + fVar38 * 0.0;
        fVar55 = fVar41 * 1.0 + fVar66 * 0.0 + fVar35 * 0.0;
        fVar56 = fVar41 * 0.0 + fVar66 * 1.0 + fVar35 * 0.0;
        fVar57 = fVar41 * 0.0 + fVar66 * 0.0 + fVar35 * 1.0;
        fVar66 = fVar41 * 0.0 + fVar66 * 0.0 + fVar35 * 0.0;
        local_38 = aVar1.x;
        fVar33 = local_38 * fVar68 + fVar45 * 0.0 + fVar55 * 0.0;
        fVar35 = local_38 * fVar70 + fVar47 * 0.0 + fVar56 * 0.0;
        fVar36 = local_38 * fVar39 + fVar48 * 0.0 + fVar57 * 0.0;
        fVar38 = local_38 * fVar40 + fVar49 * 0.0 + fVar66 * 0.0;
        local_18 = aVar1.y;
        fStack_14 = aVar1.z;
        fVar42 = fVar67 * fVar68 + fVar69 * fVar45 + fVar55 * 0.0;
        fVar51 = fVar67 * fVar70 + fVar69 * fVar47 + fVar56 * 0.0;
        fVar61 = fVar67 * fVar39 + fVar69 * fVar48 + fVar57 * 0.0;
        fVar64 = fVar67 * fVar40 + fVar69 * fVar49 + fVar66 * 0.0;
        fVar65 = fVar28 * fVar68 + fVar31 * fVar45 + fVar32 * fVar55;
        fVar73 = fVar28 * fVar70 + fVar31 * fVar47 + fVar32 * fVar56;
        fVar72 = fVar28 * fVar39 + fVar31 * fVar48 + fVar32 * fVar57;
        fVar74 = fVar28 * fVar40 + fVar31 * fVar49 + fVar32 * fVar66;
        fVar31 = fVar37 * fVar68 + fVar71 * fVar45 + fVar34 * fVar55 + local_18 + 0.0;
        fVar67 = fVar37 * fVar70 + fVar71 * fVar47 + fVar34 * fVar56 + fStack_14 + 0.0;
        fVar69 = fVar37 * fVar39 + fVar71 * fVar48 + fVar34 * fVar57 +
                 (pAVar3->l).vy.field_0.m128[2] + 0.0;
        fVar34 = fVar37 * fVar40 + fVar71 * fVar49 + fVar34 * fVar66 + 0.0;
        lVar4 = *(long *)&(pIVar2->super_Geometry).field_0x58;
        auVar29 = minps(*(undefined1 (*) [16])(lVar4 + 0x10),*(undefined1 (*) [16])(lVar4 + 0x30));
        auVar50 = maxps(*(undefined1 (*) [16])(lVar4 + 0x20),*(undefined1 (*) [16])(lVar4 + 0x40));
        fVar49 = auVar29._0_4_;
        fVar56 = auVar29._4_4_;
        fVar28 = auVar29._8_4_;
        fVar55 = fVar28 * fVar65 + fVar31;
        fVar57 = fVar28 * fVar73 + fVar67;
        fVar58 = fVar28 * fVar72 + fVar69;
        fVar59 = fVar28 * fVar74 + fVar34;
        fVar60 = fVar56 * fVar42;
        fVar62 = fVar56 * fVar51;
        fVar63 = fVar56 * fVar61;
        fVar56 = fVar56 * fVar64;
        fVar66 = fVar60 + fVar55;
        fVar68 = fVar62 + fVar57;
        fVar70 = fVar63 + fVar58;
        fVar39 = fVar56 + fVar59;
        fVar45 = fVar49 * fVar33;
        fVar47 = fVar49 * fVar35;
        fVar48 = fVar49 * fVar36;
        fVar49 = fVar49 * fVar38;
        fVar28 = fVar45 + fVar66;
        fVar32 = fVar47 + fVar68;
        fVar37 = fVar48 + fVar70;
        fVar71 = fVar49 + fVar39;
        auVar29._4_4_ = fVar32;
        auVar29._0_4_ = fVar28;
        auVar29._8_4_ = fVar37;
        auVar29._12_4_ = fVar71;
        auVar29 = minps((undefined1  [16])_DAT_01f45a30,auVar29);
        auVar52._4_4_ = fVar32;
        auVar52._0_4_ = fVar28;
        auVar52._8_4_ = fVar37;
        auVar52._12_4_ = fVar71;
        auVar52 = maxps((undefined1  [16])_DAT_01f45a40,auVar52);
        fVar40 = auVar50._0_4_;
        fVar41 = auVar50._4_4_;
        fVar28 = auVar50._8_4_;
        fVar31 = fVar28 * fVar65 + fVar31;
        fVar67 = fVar28 * fVar73 + fVar67;
        fVar69 = fVar28 * fVar72 + fVar69;
        fVar34 = fVar28 * fVar74 + fVar34;
        fVar60 = fVar60 + fVar31;
        fVar62 = fVar62 + fVar67;
        fVar63 = fVar63 + fVar69;
        fVar56 = fVar56 + fVar34;
        fVar28 = fVar45 + fVar60;
        fVar32 = fVar47 + fVar62;
        fVar37 = fVar48 + fVar63;
        fVar71 = fVar49 + fVar56;
        auVar14._4_4_ = fVar32;
        auVar14._0_4_ = fVar28;
        auVar14._8_4_ = fVar37;
        auVar14._12_4_ = fVar71;
        auVar29 = minps(auVar29,auVar14);
        auVar15._4_4_ = fVar32;
        auVar15._0_4_ = fVar28;
        auVar15._8_4_ = fVar37;
        auVar15._12_4_ = fVar71;
        auVar52 = maxps(auVar52,auVar15);
        fVar42 = fVar41 * fVar42;
        fVar51 = fVar41 * fVar51;
        fVar61 = fVar41 * fVar61;
        fVar41 = fVar41 * fVar64;
        fVar55 = fVar55 + fVar42;
        fVar57 = fVar57 + fVar51;
        fVar58 = fVar58 + fVar61;
        fVar59 = fVar59 + fVar41;
        fVar28 = fVar45 + fVar55;
        fVar32 = fVar47 + fVar57;
        fVar37 = fVar48 + fVar58;
        fVar71 = fVar49 + fVar59;
        auVar16._4_4_ = fVar32;
        auVar16._0_4_ = fVar28;
        auVar16._8_4_ = fVar37;
        auVar16._12_4_ = fVar71;
        auVar29 = minps(auVar29,auVar16);
        auVar17._4_4_ = fVar32;
        auVar17._0_4_ = fVar28;
        auVar17._8_4_ = fVar37;
        auVar17._12_4_ = fVar71;
        auVar52 = maxps(auVar52,auVar17);
        fVar42 = fVar42 + fVar31;
        fVar51 = fVar51 + fVar67;
        fVar61 = fVar61 + fVar69;
        fVar41 = fVar41 + fVar34;
        fVar45 = fVar45 + fVar42;
        fVar47 = fVar47 + fVar51;
        fVar48 = fVar48 + fVar61;
        fVar49 = fVar49 + fVar41;
        auVar50._4_4_ = fVar47;
        auVar50._0_4_ = fVar45;
        auVar50._8_4_ = fVar48;
        auVar50._12_4_ = fVar49;
        auVar29 = minps(auVar29,auVar50);
        auVar11._4_4_ = fVar47;
        auVar11._0_4_ = fVar45;
        auVar11._8_4_ = fVar48;
        auVar11._12_4_ = fVar49;
        auVar52 = maxps(auVar52,auVar11);
        fVar33 = fVar40 * fVar33;
        fVar35 = fVar40 * fVar35;
        fVar36 = fVar40 * fVar36;
        fVar40 = fVar40 * fVar38;
        fVar66 = fVar66 + fVar33;
        fVar68 = fVar68 + fVar35;
        fVar70 = fVar70 + fVar36;
        fVar39 = fVar39 + fVar40;
        auVar12._4_4_ = fVar68;
        auVar12._0_4_ = fVar66;
        auVar12._8_4_ = fVar70;
        auVar12._12_4_ = fVar39;
        auVar29 = minps(auVar29,auVar12);
        auVar13._4_4_ = fVar68;
        auVar13._0_4_ = fVar66;
        auVar13._8_4_ = fVar70;
        auVar13._12_4_ = fVar39;
        auVar52 = maxps(auVar52,auVar13);
        fVar60 = fVar60 + fVar33;
        fVar62 = fVar62 + fVar35;
        fVar63 = fVar63 + fVar36;
        fVar56 = fVar56 + fVar40;
        auVar20._4_4_ = fVar62;
        auVar20._0_4_ = fVar60;
        auVar20._8_4_ = fVar63;
        auVar20._12_4_ = fVar56;
        auVar29 = minps(auVar29,auVar20);
        auVar21._4_4_ = fVar62;
        auVar21._0_4_ = fVar60;
        auVar21._8_4_ = fVar63;
        auVar21._12_4_ = fVar56;
        auVar52 = maxps(auVar52,auVar21);
        auVar54._0_4_ = fVar55 + fVar33;
        auVar54._4_4_ = fVar57 + fVar35;
        auVar54._8_4_ = fVar58 + fVar36;
        auVar54._12_4_ = fVar59 + fVar40;
        auVar29 = minps(auVar29,auVar54);
        auVar52 = maxps(auVar52,auVar54);
        auVar46._0_4_ = fVar33 + fVar42;
        auVar46._4_4_ = fVar35 + fVar51;
        auVar46._8_4_ = fVar36 + fVar61;
        auVar46._12_4_ = fVar40 + fVar41;
        auVar29 = minps(auVar29,auVar46);
        auVar52 = maxps(auVar52,auVar46);
      }
      else {
        fVar28 = (pAVar3->l).vx.field_0.m128[0];
        fVar31 = (pAVar3->l).vx.field_0.m128[1];
        fVar32 = (pAVar3->l).vx.field_0.m128[2];
        fVar37 = (pAVar3->l).vx.field_0.m128[3];
        fVar67 = (pAVar3->l).vy.field_0.m128[0];
        fVar69 = (pAVar3->l).vy.field_0.m128[1];
        fVar71 = (pAVar3->l).vy.field_0.m128[2];
        fVar34 = (pAVar3->l).vy.field_0.m128[3];
        fVar33 = (pAVar3->l).vz.field_0.m128[0];
        fVar35 = (pAVar3->l).vz.field_0.m128[1];
        fVar36 = (pAVar3->l).vz.field_0.m128[2];
        fVar38 = (pAVar3->l).vz.field_0.m128[3];
        fVar45 = (pAVar3->p).field_0.m128[0];
        fVar47 = (pAVar3->p).field_0.m128[1];
        fVar48 = (pAVar3->p).field_0.m128[2];
        fVar49 = (pAVar3->p).field_0.m128[3];
        lVar4 = *(long *)&(pIVar2->super_Geometry).field_0x58;
        auVar52 = minps(*(undefined1 (*) [16])(lVar4 + 0x10),*(undefined1 (*) [16])(lVar4 + 0x30));
        auVar29 = maxps(*(undefined1 (*) [16])(lVar4 + 0x20),*(undefined1 (*) [16])(lVar4 + 0x40));
        fVar42 = auVar52._0_4_;
        fVar61 = auVar52._4_4_;
        fVar66 = auVar52._8_4_;
        fVar51 = fVar66 * fVar33 + fVar45;
        fVar55 = fVar66 * fVar35 + fVar47;
        fVar56 = fVar66 * fVar36 + fVar48;
        fVar57 = fVar66 * fVar38 + fVar49;
        fVar58 = fVar61 * fVar67;
        fVar59 = fVar61 * fVar69;
        fVar60 = fVar61 * fVar71;
        fVar61 = fVar61 * fVar34;
        fVar62 = fVar58 + fVar51;
        fVar63 = fVar59 + fVar55;
        fVar64 = fVar60 + fVar56;
        fVar65 = fVar61 + fVar57;
        fVar39 = fVar42 * fVar28;
        fVar40 = fVar42 * fVar31;
        fVar41 = fVar42 * fVar32;
        fVar42 = fVar42 * fVar37;
        fVar66 = fVar39 + fVar62;
        fVar68 = fVar40 + fVar63;
        fVar70 = fVar41 + fVar64;
        fVar73 = fVar42 + fVar65;
        auVar24._4_4_ = fVar68;
        auVar24._0_4_ = fVar66;
        auVar24._8_4_ = fVar70;
        auVar24._12_4_ = fVar73;
        auVar52 = minps((undefined1  [16])_DAT_01f45a30,auVar24);
        auVar25._4_4_ = fVar68;
        auVar25._0_4_ = fVar66;
        auVar25._8_4_ = fVar70;
        auVar25._12_4_ = fVar73;
        auVar50 = maxps((undefined1  [16])_DAT_01f45a40,auVar25);
        fVar66 = auVar29._0_4_;
        fVar68 = auVar29._4_4_;
        fVar70 = auVar29._8_4_;
        fVar45 = fVar70 * fVar33 + fVar45;
        fVar47 = fVar70 * fVar35 + fVar47;
        fVar48 = fVar70 * fVar36 + fVar48;
        fVar49 = fVar70 * fVar38 + fVar49;
        fVar58 = fVar58 + fVar45;
        fVar59 = fVar59 + fVar47;
        fVar60 = fVar60 + fVar48;
        fVar61 = fVar61 + fVar49;
        fVar33 = fVar39 + fVar58;
        fVar35 = fVar40 + fVar59;
        fVar36 = fVar41 + fVar60;
        fVar38 = fVar42 + fVar61;
        auVar5._4_4_ = fVar35;
        auVar5._0_4_ = fVar33;
        auVar5._8_4_ = fVar36;
        auVar5._12_4_ = fVar38;
        auVar29 = minps(auVar52,auVar5);
        auVar6._4_4_ = fVar35;
        auVar6._0_4_ = fVar33;
        auVar6._8_4_ = fVar36;
        auVar6._12_4_ = fVar38;
        auVar52 = maxps(auVar50,auVar6);
        fVar67 = fVar68 * fVar67;
        fVar69 = fVar68 * fVar69;
        fVar71 = fVar68 * fVar71;
        fVar68 = fVar68 * fVar34;
        fVar51 = fVar51 + fVar67;
        fVar55 = fVar55 + fVar69;
        fVar56 = fVar56 + fVar71;
        fVar57 = fVar57 + fVar68;
        fVar34 = fVar39 + fVar51;
        fVar33 = fVar40 + fVar55;
        fVar35 = fVar41 + fVar56;
        fVar36 = fVar42 + fVar57;
        auVar7._4_4_ = fVar33;
        auVar7._0_4_ = fVar34;
        auVar7._8_4_ = fVar35;
        auVar7._12_4_ = fVar36;
        auVar29 = minps(auVar29,auVar7);
        auVar8._4_4_ = fVar33;
        auVar8._0_4_ = fVar34;
        auVar8._8_4_ = fVar35;
        auVar8._12_4_ = fVar36;
        auVar52 = maxps(auVar52,auVar8);
        fVar67 = fVar67 + fVar45;
        fVar69 = fVar69 + fVar47;
        fVar71 = fVar71 + fVar48;
        fVar68 = fVar68 + fVar49;
        fVar39 = fVar39 + fVar67;
        fVar40 = fVar40 + fVar69;
        fVar41 = fVar41 + fVar71;
        fVar42 = fVar42 + fVar68;
        auVar9._4_4_ = fVar40;
        auVar9._0_4_ = fVar39;
        auVar9._8_4_ = fVar41;
        auVar9._12_4_ = fVar42;
        auVar29 = minps(auVar29,auVar9);
        auVar10._4_4_ = fVar40;
        auVar10._0_4_ = fVar39;
        auVar10._8_4_ = fVar41;
        auVar10._12_4_ = fVar42;
        auVar52 = maxps(auVar52,auVar10);
        fVar28 = fVar66 * fVar28;
        fVar31 = fVar66 * fVar31;
        fVar32 = fVar66 * fVar32;
        fVar66 = fVar66 * fVar37;
        fVar62 = fVar62 + fVar28;
        fVar63 = fVar63 + fVar31;
        fVar64 = fVar64 + fVar32;
        fVar65 = fVar65 + fVar66;
        auVar22._4_4_ = fVar63;
        auVar22._0_4_ = fVar62;
        auVar22._8_4_ = fVar64;
        auVar22._12_4_ = fVar65;
        auVar29 = minps(auVar29,auVar22);
        auVar23._4_4_ = fVar63;
        auVar23._0_4_ = fVar62;
        auVar23._8_4_ = fVar64;
        auVar23._12_4_ = fVar65;
        auVar52 = maxps(auVar52,auVar23);
        fVar58 = fVar58 + fVar28;
        fVar59 = fVar59 + fVar31;
        fVar60 = fVar60 + fVar32;
        fVar61 = fVar61 + fVar66;
        auVar18._4_4_ = fVar59;
        auVar18._0_4_ = fVar58;
        auVar18._8_4_ = fVar60;
        auVar18._12_4_ = fVar61;
        auVar29 = minps(auVar29,auVar18);
        auVar19._4_4_ = fVar59;
        auVar19._0_4_ = fVar58;
        auVar19._8_4_ = fVar60;
        auVar19._12_4_ = fVar61;
        auVar52 = maxps(auVar52,auVar19);
        auVar53._0_4_ = fVar51 + fVar28;
        auVar53._4_4_ = fVar55 + fVar31;
        auVar53._8_4_ = fVar56 + fVar32;
        auVar53._12_4_ = fVar57 + fVar66;
        auVar29 = minps(auVar29,auVar53);
        auVar52 = maxps(auVar52,auVar53);
        auVar30._0_4_ = fVar28 + fVar67;
        auVar30._4_4_ = fVar31 + fVar69;
        auVar30._8_4_ = fVar32 + fVar71;
        auVar30._12_4_ = fVar66 + fVar68;
        auVar29 = minps(auVar29,auVar30);
        auVar52 = maxps(auVar52,auVar30);
      }
      aVar44.m128 = (__m128)minps(aVar44.m128,auVar29);
      aVar43.m128 = (__m128)maxps(aVar43.m128,auVar52);
    }
    (__return_storage_ptr__->lower).field_0 = aVar44;
    (__return_storage_ptr__->upper).field_0 = aVar43;
    return __return_storage_ptr__;
  }
  *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)&(__return_storage_ptr__->upper).field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = 0xff800000ff800000;
  return __return_storage_ptr__;
}

Assistant:

virtual const BBox3fa leafBounds (NodeRef& ref) const
      {
        size_t num; char* prim = ref.leaf(num);
        if (unlikely(ref == BVH::emptyNode)) return empty;

        BBox3fa bounds = empty;
        for (size_t i=0; i<num; i++)
            bounds.extend(((Primitive*)prim)[i].update(mesh));
        return bounds;
      }